

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_lock_validator.hpp
# Opt level: O0

void yamc::validator::deadlock::unlocked(uintptr_t mkey,id tid,bool shared)

{
  mapped_type *pmVar1;
  table_ref local_48;
  table_ref *local_28;
  table_ref *table;
  uintptr_t uStack_18;
  bool shared_local;
  uintptr_t mkey_local;
  id tid_local;
  
  table._7_1_ = shared;
  uStack_18 = mkey;
  mkey_local = tid._M_thread;
  global_table();
  local_28 = &local_48;
  pmVar1 = std::
           unordered_map<unsigned_long,_yamc::validator::deadlock::entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_yamc::validator::deadlock::entry>_>_>
           ::operator[](local_48.mutexmap,&stack0xffffffffffffffe8);
  remove_elem<std::thread::id>(&pmVar1->owners,(id)mkey_local);
  table_ref::~table_ref(&local_48);
  return;
}

Assistant:

static void unlocked(uintptr_t mkey, std::thread::id tid, bool shared)
  {
    auto&& table = global_table();
    remove_elem(table.mutexmap[mkey].owners, tid);
#if YAMC_CHECK_VERBOSE
    std::cout << "Thread#" << tid << " released Mutex#" << table.mutexmap[mkey].mid
      << " " << (shared ? "shared-lock" : "lock") << '\n';
    dump_mutexmap(std::cout, table.mutexmap);
#else
    (void)shared;  // suppress "unused variable" warning
#endif
  }